

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

buffer * bfind(char *bname,int cflag)

{
  int iVar1;
  buffer *local_28;
  buffer *bp;
  int cflag_local;
  char *bname_local;
  
  local_28 = bheadp;
  while( true ) {
    if (local_28 == (buffer *)0x0) {
      if (cflag == 1) {
        bname_local = (char *)bnew(bname);
      }
      else {
        bname_local = (char *)0x0;
      }
      return (buffer *)bname_local;
    }
    iVar1 = strcmp(bname,(local_28->b_list).l_name);
    if (iVar1 == 0) break;
    local_28 = (buffer *)(local_28->b_list).l_p.l_wp;
  }
  return local_28;
}

Assistant:

struct buffer *
bfind(const char *bname, int cflag)
{
	struct buffer	*bp;

	bp = bheadp;
	while (bp != NULL) {
		if (strcmp(bname, bp->b_bname) == 0)
			return (bp);
		bp = bp->b_bufp;
	}
	if (cflag != TRUE)
		return (NULL);

	bp = bnew(bname);

	return (bp);
}